

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::ChaiScript::internal_eval_file(ChaiScript *this,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  file_not_found_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> appendedpath;
  
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           ((long)&t_filename[7].field_2 + 8);
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               t_filename[8]._M_dataplus._M_p) {
    std::operator+(&appendedpath,__lhs,in_RDX);
    load_file(&local_70,&appendedpath);
    do_eval(this,t_filename,&local_70,SUB81(&appendedpath,0));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&appendedpath);
    BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar1.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (file_not_found_error *)__cxa_allocate_exception(0x10);
  exception::file_not_found_error::file_not_found_error(this_00,in_RDX);
  __cxa_throw(this_00,&exception::file_not_found_error::typeinfo,std::runtime_error::~runtime_error)
  ;
}

Assistant:

const Boxed_Value internal_eval_file(const std::string &t_filename) {
      for (const auto &path : m_use_paths)
      {
        try {
          const auto appendedpath = path + t_filename;
          return do_eval(load_file(appendedpath), appendedpath, true);
        } catch (const exception::file_not_found_error &) {
          // failed to load, try the next path
        } catch (const exception::eval_error &t_ee) {
          throw Boxed_Value(t_ee);
        }
      }

      // failed to load by any name
      throw exception::file_not_found_error(t_filename);

    }